

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

bool __thiscall wirehair::Codec::AllocateInput(Codec *this)

{
  uint8_t *puVar1;
  bool bVar2;
  ulong size;
  
  size = (ulong)this->_block_bytes * ((ulong)this->_extra_count + (ulong)this->_block_count);
  bVar2 = true;
  if (this->_input_allocated < size) {
    if ((this->_input_allocated != 0) && (this->_input_blocks != (uint8_t *)0x0)) {
      SIMDSafeFree(this->_input_blocks);
      this->_input_blocks = (uint8_t *)0x0;
    }
    this->_input_allocated = 0;
    puVar1 = SIMDSafeAllocate(size);
    this->_input_blocks = puVar1;
    if (puVar1 == (uint8_t *)0x0) {
      bVar2 = false;
    }
    else {
      this->_input_allocated = size;
    }
  }
  return bVar2;
}

Assistant:

bool Codec::AllocateInput()
{
    CAT_IF_DUMP(cout << endl << "---- AllocateInput ----" << endl << endl;)

    const uint64_t sizeBytes = static_cast<uint64_t>(_block_count + _extra_count) * _block_bytes;

    // If need to allocate more:
    if (_input_allocated < sizeBytes)
    {
        FreeInput();

        // Allocate input blocks
        _input_blocks = SIMDSafeAllocate((size_t)sizeBytes);
        if (!_input_blocks) {
            return false;
        }

        _input_allocated = sizeBytes;
    }

    return true;
}